

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

Doctor * __thiscall
Hospital::Find_Doctor_From_His_Id
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  Doctor::doctor_all_ino_getter_abi_cxx11_
            (&local_30,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

Doctor* Hospital:: Find_Doctor_From_His_Id (vector<Doctor>& All_Of_Doctors,string id){
    for (int A = 0; A < All_Of_Doctors.size() ; ++A) {
        if (All_Of_Doctors[A].doctor_all_ino_getter()[0]==id)
            return  &All_Of_Doctors [A];
        break;
    }
}